

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_features.c
# Opt level: O0

void libdeflate_init_x86_cpu_features(void)

{
  _Bool _Var1;
  u32 features;
  u64 xcr0;
  u32 d;
  u32 c;
  u32 b;
  u32 a;
  u32 model;
  u32 family;
  u32 manufacturer [3];
  u32 max_leaf;
  u32 local_34;
  u64 xcr0_00;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  u32 local_10;
  u32 uStack_c;
  u32 uStack_8;
  uint local_4;
  
  xcr0_00 = 0;
  local_34 = 0;
  cpuid(0,0,&local_4,&local_10,&uStack_8,&uStack_c);
  if (local_4 != 0) {
    cpuid(1,0,&local_1c,&local_20,(u32 *)&stack0xffffffffffffffdc,(u32 *)&stack0xffffffffffffffd8);
    local_14 = local_1c >> 8 & 0xf;
    local_18 = local_1c >> 4 & 0xf;
    if ((local_14 == 6) || (local_14 == 0xf)) {
      local_18 = (local_1c >> 0xc & 0xf0) + local_18;
    }
    if (local_14 == 0xf) {
      local_14 = (local_1c >> 0x14 & 0xff) + 0xf;
    }
    if ((in_stack_ffffffffffffffd8 & 0x4000000) != 0) {
      local_34 = local_34 | 1;
    }
    if (((in_stack_ffffffffffffffdc & 2) != 0) && ((in_stack_ffffffffffffffdc & 0x80000) != 0)) {
      local_34 = local_34 | 2;
    }
    if ((in_stack_ffffffffffffffdc & 0x8000000) != 0) {
      xcr0_00 = read_xcr(0);
    }
    if (((in_stack_ffffffffffffffdc & 0x10000000) != 0) && ((xcr0_00 & 6) == 6)) {
      local_34 = local_34 | 4;
    }
    if (6 < local_4) {
      cpuid(7,0,&local_1c,&local_20,(u32 *)&stack0xffffffffffffffdc,(u32 *)&stack0xffffffffffffffd8)
      ;
      if ((local_20 & 0x100) != 0) {
        local_34 = local_34 | 0x10;
      }
      if ((xcr0_00 & 6) == 6) {
        if ((local_20 & 0x20) != 0) {
          local_34 = local_34 | 8;
        }
        if ((in_stack_ffffffffffffffdc & 0x400) != 0) {
          local_34 = local_34 | 0x100;
        }
      }
      _Var1 = os_supports_avx512(xcr0_00);
      if (_Var1) {
        _Var1 = allow_512bit_vectors
                          ((u32 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                           (u32)(xcr0_00 >> 0x20),(u32)xcr0_00);
        if (_Var1) {
          local_34 = local_34 | 0x20;
        }
        if ((local_20 & 0x40000000) != 0) {
          local_34 = local_34 | 0x40;
        }
        if ((local_20 & 0x80000000) != 0) {
          local_34 = local_34 | 0x80;
        }
        if ((in_stack_ffffffffffffffdc & 0x800) != 0) {
          local_34 = local_34 | 0x200;
        }
      }
      cpuid(7,1,&local_1c,&local_20,(u32 *)&stack0xffffffffffffffdc,(u32 *)&stack0xffffffffffffffd8)
      ;
      if (((local_1c & 0x10) != 0) && ((xcr0_00 & 6) == 6)) {
        local_34 = local_34 | 0x400;
      }
    }
  }
  disable_cpu_features_for_testing(&local_34,x86_cpu_feature_table,0xb);
  libdeflate_x86_cpu_features = local_34 | 0x80000000;
  return;
}

Assistant:

void libdeflate_init_x86_cpu_features(void)
{
	u32 max_leaf;
	u32 manufacturer[3];
	u32 family, model;
	u32 a, b, c, d;
	u64 xcr0 = 0;
	u32 features = 0;

	/* EAX=0: Highest Function Parameter and Manufacturer ID */
	cpuid(0, 0, &max_leaf, &manufacturer[0], &manufacturer[2],
	      &manufacturer[1]);
	if (max_leaf < 1)
		goto out;

	/* EAX=1: Processor Info and Feature Bits */
	cpuid(1, 0, &a, &b, &c, &d);
	family = (a >> 8) & 0xf;
	model = (a >> 4) & 0xf;
	if (family == 6 || family == 0xf)
		model += (a >> 12) & 0xf0;
	if (family == 0xf)
		family += (a >> 20) & 0xff;
	if (d & (1 << 26))
		features |= X86_CPU_FEATURE_SSE2;
	/*
	 * No known CPUs have pclmulqdq without sse4.1, so in practice code
	 * targeting pclmulqdq can use sse4.1 instructions.  But to be safe,
	 * explicitly check for both the pclmulqdq and sse4.1 bits.
	 */
	if ((c & (1 << 1)) && (c & (1 << 19)))
		features |= X86_CPU_FEATURE_PCLMULQDQ;
	if (c & (1 << 27))
		xcr0 = read_xcr(0);
	if ((c & (1 << 28)) && ((xcr0 & 0x6) == 0x6))
		features |= X86_CPU_FEATURE_AVX;

	if (max_leaf < 7)
		goto out;

	/* EAX=7, ECX=0: Extended Features */
	cpuid(7, 0, &a, &b, &c, &d);
	if (b & (1 << 8))
		features |= X86_CPU_FEATURE_BMI2;
	if ((xcr0 & 0x6) == 0x6) {
		if (b & (1 << 5))
			features |= X86_CPU_FEATURE_AVX2;
		if (c & (1 << 10))
			features |= X86_CPU_FEATURE_VPCLMULQDQ;
	}
	if (os_supports_avx512(xcr0)) {
		if (allow_512bit_vectors(manufacturer, family, model))
			features |= X86_CPU_FEATURE_ZMM;
		if (b & (1 << 30))
			features |= X86_CPU_FEATURE_AVX512BW;
		if (b & (1U << 31))
			features |= X86_CPU_FEATURE_AVX512VL;
		if (c & (1 << 11))
			features |= X86_CPU_FEATURE_AVX512VNNI;
	}

	/* EAX=7, ECX=1: Extended Features */
	cpuid(7, 1, &a, &b, &c, &d);
	if ((a & (1 << 4)) && ((xcr0 & 0x6) == 0x6))
		features |= X86_CPU_FEATURE_AVXVNNI;

out:
	disable_cpu_features_for_testing(&features, x86_cpu_feature_table,
					 ARRAY_LEN(x86_cpu_feature_table));

	libdeflate_x86_cpu_features = features | X86_CPU_FEATURES_KNOWN;
}